

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_handler.cc
# Opt level: O1

void print_string(string *path,string *value)

{
  ostream *poVar1;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(path->_M_dataplus)._M_p,path->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": string: ",10);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(value->_M_dataplus)._M_p,value->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

static void
print_string(std::string const& path, std::string const& value)
{
    std::cout << path << ": string: " << value << std::endl;
}